

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O0

void cid_size_done(FT_Size cidsize)

{
  PSH_Globals_Funcs pPVar1;
  PSH_Globals_Funcs funcs;
  CID_Size size;
  FT_Size cidsize_local;
  
  if (cidsize->internal->module_data != (void *)0x0) {
    pPVar1 = cid_size_get_globals_funcs((CID_Size)cidsize);
    if (pPVar1 != (PSH_Globals_Funcs)0x0) {
      (*pPVar1->destroy)((PSH_Globals)cidsize->internal->module_data);
    }
    cidsize->internal->module_data = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cid_size_done( FT_Size  cidsize )         /* CID_Size */
  {
    CID_Size  size = (CID_Size)cidsize;


    if ( cidsize->internal->module_data )
    {
      PSH_Globals_Funcs  funcs;


      funcs = cid_size_get_globals_funcs( size );
      if ( funcs )
        funcs->destroy( (PSH_Globals)cidsize->internal->module_data );

      cidsize->internal->module_data = NULL;
    }
  }